

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

string_type * __thiscall
booster::locale::basic_message<char>::str_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_message<char> *this,locale *loc,int id)

{
  char *pcVar1;
  char *pcVar2;
  char_type *ptr;
  int id_local;
  locale *loc_local;
  basic_message<char> *this_local;
  string_type *buffer;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = (char *)write(this,(int)loc,(void *)(ulong)(uint)id,(size_t)__return_storage_ptr__);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  if (pcVar1 != pcVar2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type str(std::locale const &loc,int id) const
            {
                string_type buffer;                
                char_type const *ptr = write(loc,id,buffer);
                if(ptr == buffer.c_str())
                    return buffer;
                else
                    buffer = ptr;
                return buffer;
            }